

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

void Saig_Bmc3ManStop(Gia_ManBmc_t *p)

{
  Vec_Wec_t *__ptr;
  void *pvVar1;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  Hsh_IntMan_t *__ptr_00;
  Vec_Wrd_t *__ptr_01;
  word *__ptr_02;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  int level;
  bmcg_sat_solver *s;
  satoko_t *s_00;
  Vec_Int_t *pVVar8;
  char **__ptr_03;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  undefined8 local_40;
  sat_solver *psVar7;
  
  if (p->pPars->fVerbose != 0) {
    psVar7 = p->pSat;
    if (psVar7 == (sat_solver *)0x0) {
      uVar11 = 0;
LAB_0056845b:
      if (p->pSat3 == (bmcg_sat_solver *)0x0) {
        iVar4 = satoko_varnum(p->pSat2);
        local_40 = CONCAT44(extraout_var_01,iVar4);
      }
      else {
        iVar4 = bmcg_sat_solver_varnum(p->pSat3);
        local_40 = CONCAT44(extraout_var,iVar4);
      }
      uVar6 = 0;
      uVar12 = 0;
      uVar9 = 0;
      uVar10 = 0;
    }
    else {
      iVar4 = psVar7->size;
      if (iVar4 < 1) {
        uVar11 = 0;
      }
      else {
        lVar5 = 0;
        uVar11 = 0;
        do {
          if (psVar7->pFreqs[lVar5] != '\0') {
            psVar7->pFreqs[lVar5] = '\0';
            uVar11 = (ulong)((int)uVar11 + 1);
            iVar4 = psVar7->size;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar4);
        psVar7 = p->pSat;
        if (psVar7 == (sat_solver *)0x0) goto LAB_0056845b;
      }
      uVar9 = (ulong)(uint)psVar7->nLearntStart;
      uVar12 = (ulong)(uint)psVar7->nLearntDelta;
      uVar10 = psVar7->nLearntRatio;
      uVar6 = psVar7->nDBreduces;
      iVar4 = sat_solver_nvars(psVar7);
      local_40 = CONCAT44(extraout_var_00,iVar4);
    }
    psVar7 = p->pSat;
    if (psVar7 == (sat_solver *)0x0) {
      s = p->pSat3;
      if (s == (bmcg_sat_solver *)0x0) {
        s_00 = p->pSat2;
        iVar4 = satoko_varnum(s_00);
        level = (int)s_00;
      }
      else {
        iVar4 = bmcg_sat_solver_varnum(s);
        level = (int)s;
      }
    }
    else {
      iVar4 = sat_solver_nvars(psVar7);
      level = (int)psVar7;
    }
    Abc_Print(level,
              "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n"
              ,((double)(int)uVar11 * 100.0) / (double)iVar4,uVar9,uVar12,(ulong)uVar10,(ulong)uVar6
              ,local_40,uVar11);
    Abc_Print(p->nUniProps,
              "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n",
              (ulong)(uint)p->nBufNum,(ulong)(uint)p->nDupNum,(ulong)(uint)p->nHashHit,
              (ulong)(uint)p->nHashMiss,(ulong)(uint)p->nUniProps);
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                    ,0x332,"void Saig_Bmc3ManStop(Gia_ManBmc_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  __ptr = p->vVisited;
  iVar4 = __ptr->nCap;
  pVVar8 = __ptr->pArray;
  if (iVar4 < 1) {
    if (pVVar8 != (Vec_Int_t *)0x0) goto LAB_005685cb;
  }
  else {
    lVar13 = 8;
    lVar5 = 0;
    do {
      pvVar1 = *(void **)((long)&pVVar8->nCap + lVar13);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        pVVar8 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar8->nCap + lVar13) = 0;
        iVar4 = __ptr->nCap;
      }
      lVar5 = lVar5 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar5 < iVar4);
LAB_005685cb:
    free(pVVar8);
  }
  free(__ptr);
  pVVar8 = p->vMapping;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar8 = p->vMapRefs;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar8 = p->vId2Num;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  pVVar3 = p->vId2Var;
  iVar4 = pVVar3->nSize;
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar5];
      if (pvVar1 != (void *)0x0) {
        if (*(void **)((long)pvVar1 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar1 + 8));
        }
        free(pvVar1);
        iVar4 = pVVar3->nSize;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar3 = p->vTerInfo;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar4 = pVVar3->nSize;
    if (0 < iVar4) {
      lVar5 = 0;
      do {
        if ((void *)0x2 < pVVar3->pArray[lVar5]) {
          free(pVVar3->pArray[lVar5]);
          iVar4 = pVVar3->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar4);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pSat2 != (solver_t *)0x0) {
    satoko_destroy(p->pSat2);
  }
  if (p->pSat3 != (bmcg_sat_solver *)0x0) {
    bmcg_sat_solver_stop(p->pSat3);
  }
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar8 = p->vData;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  __ptr_00 = p->vHash;
  pVVar8 = __ptr_00->vTable;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  __ptr_01 = __ptr_00->vObjs;
  __ptr_02 = __ptr_01->pArray;
  if (__ptr_02 != (word *)0x0) {
    free(__ptr_02);
  }
  free(__ptr_01);
  free(__ptr_00);
  pVVar8 = p->vId2Lit;
  piVar2 = pVVar8->pArray;
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(pVVar8);
  if (p->pSopSizes != (char *)0x0) {
    free(p->pSopSizes);
    p->pSopSizes = (char *)0x0;
  }
  __ptr_03 = p->pSops;
  if (__ptr_03[1] != (char *)0x0) {
    free(__ptr_03[1]);
    p->pSops[1] = (char *)0x0;
    __ptr_03 = p->pSops;
    if (__ptr_03 == (char **)0x0) goto LAB_005687da;
  }
  free(__ptr_03);
LAB_005687da:
  free(p);
  return;
}

Assistant:

void Saig_Bmc3ManStop( Gia_ManBmc_t * p )
{
    if ( p->pPars->fVerbose )
    {
        int nUsedVars = p->pSat ? sat_solver_count_usedvars(p->pSat) : 0;
        Abc_Print( 1, "LStart(P) = %d  LDelta(Q) = %d  LRatio(R) = %d  ReduceDB = %d  Vars = %d  Used = %d (%.2f %%)\n", 
            p->pSat ? p->pSat->nLearntStart     : 0, 
            p->pSat ? p->pSat->nLearntDelta     : 0, 
            p->pSat ? p->pSat->nLearntRatio     : 0, 
            p->pSat ? p->pSat->nDBreduces       : 0, 
            p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2), 
            nUsedVars, 
            100.0*nUsedVars/(p->pSat ? sat_solver_nvars(p->pSat) : p->pSat3 ? bmcg_sat_solver_varnum(p->pSat3) : satoko_varnum(p->pSat2)) );
        Abc_Print( 1, "Buffs = %d. Dups = %d.   Hash hits = %d.  Hash misses = %d.  UniProps = %d.\n", 
            p->nBufNum, p->nDupNum, p->nHashHit, p->nHashMiss, p->nUniProps );
    }
//    Aig_ManCleanMarkA( p->pAig );
    if ( p->vCexes )
    {
        assert( p->pAig->vSeqModelVec == NULL );
        p->pAig->vSeqModelVec = p->vCexes;
        p->vCexes = NULL;
    }
//    Vec_PtrFreeFree( p->vCexes );
    Vec_WecFree( p->vVisited );
    Vec_IntFree( p->vMapping );
    Vec_IntFree( p->vMapRefs );
//    Vec_VecFree( p->vSects );
    Vec_IntFree( p->vId2Num );
    Vec_VecFree( (Vec_Vec_t *)p->vId2Var );
    Vec_PtrFreeFree( p->vTerInfo );
    if ( p->pSat )  sat_solver_delete( p->pSat );
    if ( p->pSat2 ) satoko_destroy( p->pSat2 );
    if ( p->pSat3 ) bmcg_sat_solver_stop( p->pSat3 );
    ABC_FREE( p->pTime4Outs );
    Vec_IntFree( p->vData );
    Hsh_IntManStop( p->vHash );
    Vec_IntFree( p->vId2Lit );
    ABC_FREE( p->pSopSizes );
    ABC_FREE( p->pSops[1] );
    ABC_FREE( p->pSops );
    ABC_FREE( p );
}